

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O2

objc_slot * objc_msg_lookup_sender(id *receiver,SEL selector,id sender)

{
  char cVar1;
  Class cls;
  uint32_t index;
  uintptr_t addr;
  objc_slot2 *poVar2;
  objc_slot *poVar3;
  char *pcVar4;
  dtable_t sarray;
  IMP p_Var5;
  id poVar6;
  
  poVar6 = *receiver;
  if (poVar6 == (id)0x0) {
    poVar3 = &nil_slot_v1;
    if (selector->types != (char *)0x0) {
      cVar1 = *selector->types;
      if (cVar1 == 'D') {
        poVar3 = &nil_slot_D_v1;
      }
      else if (cVar1 == 'f') {
        poVar3 = &nil_slot_f_v1;
      }
      else if (cVar1 == 'd') {
        poVar3 = &nil_slot_d_v1;
      }
    }
  }
  else {
    if (((ulong)poVar6 & 7) != 0) {
      poVar6 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)poVar6 & 7) << 3));
    }
    cls = poVar6->isa;
    poVar2 = (objc_slot2 *)
             SparseArrayLookup((SparseArray *)cls->dtable,*(uint32_t *)&selector->field_0);
    if (poVar2 == (objc_slot2 *)0x0) {
      sarray = dtable_for_class(cls);
      if (sarray == uninstalled_dtable) {
        objc_send_initialize(*receiver);
        sarray = dtable_for_class(cls);
      }
      poVar2 = (objc_slot2 *)SparseArrayLookup(sarray,*(uint32_t *)&selector->field_0);
      if (poVar2 == (objc_slot2 *)0x0) {
        index = get_untyped_idx(selector);
        poVar2 = (objc_slot2 *)SparseArrayLookup(sarray,index);
        if (poVar2 == (objc_slot2 *)0x0) {
          poVar2 = (objc_slot2 *)0x0;
        }
        else {
          p_Var5 = call_mismatch_hook(cls,selector,poVar2);
          poVar2 = (objc_slot2 *)__tls_get_addr(&PTR_00129f50);
          poVar2->method = p_Var5;
        }
        poVar6 = (*objc_proxy_lookup)(*receiver,selector);
        if (poVar6 == (id)0x0) {
          if (poVar2 == (objc_slot2 *)0x0) {
            p_Var5 = (*__objc_msg_forward2)(*receiver,selector);
            poVar2 = (objc_slot2 *)__tls_get_addr(&PTR_00129f50);
            poVar2->method = p_Var5;
          }
        }
        else {
          *receiver = poVar6;
          poVar2 = objc_slot_lookup(receiver,selector);
        }
      }
    }
    poVar3 = (objc_slot *)__tls_get_addr(&PTR_00129f08);
    poVar3->owner = (Class)0x0;
    pcVar4 = sel_getType_np((SEL)poVar2[1].method);
    poVar3->types = pcVar4;
    poVar3->selector = selector;
    poVar3->method = poVar2->method;
  }
  return poVar3;
}

Assistant:

struct objc_slot *objc_msg_lookup_sender(id *receiver, SEL selector, id sender)
{
	// Returning a nil slot allows the caller to cache the lookup for nil too,
	// although this is not particularly useful because the nil method can be
	// inlined trivially.
	if (UNLIKELY(*receiver == nil))
	{
		// Return the correct kind of zero, depending on the type encoding.
		if (selector->types)
		{
			const char *t = selector->types;
			// Skip type qualifiers
			while ('r' == *t || 'n' == *t || 'N' == *t || 'o' == *t ||
			       'O' == *t || 'R' == *t || 'V' == *t || 'A' == *t)
			{
				t++;
			}
			switch (selector->types[0])
			{
				case 'D': return &nil_slot_D_v1;
				case 'd': return &nil_slot_d_v1;
				case 'f': return &nil_slot_f_v1;
			}
		}
		return &nil_slot_v1;
	}

	struct objc_slot2 *slot = objc_msg_lookup_internal(receiver, selector, NULL);
	uncacheable_slot_v1.owner = Nil;
	uncacheable_slot_v1.types = sel_getType_np(((struct objc_method*)slot)->selector);
	uncacheable_slot_v1.selector = selector;
	uncacheable_slot_v1.method = slot->method;
	return &uncacheable_slot_v1;
}